

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O0

int lh_table_delete_entry(lh_table *t,lh_entry *e)

{
  long lVar1;
  ptrdiff_t n;
  lh_entry *e_local;
  lh_table *t_local;
  
  lVar1 = ((long)e - (long)t->table) / 0x28;
  if (lVar1 < 0) {
    t_local._4_4_ = -2;
  }
  else if ((t->table[lVar1].k == (void *)0xffffffffffffffff) ||
          (t->table[lVar1].k == (void *)0xfffffffffffffffe)) {
    t_local._4_4_ = -1;
  }
  else {
    t->count = t->count + -1;
    if (t->free_fn != (lh_entry_free_fn *)0x0) {
      (*t->free_fn)(e);
    }
    t->table[lVar1].v = (void *)0x0;
    t->table[lVar1].k = (void *)0xfffffffffffffffe;
    if ((t->tail == t->table + lVar1) && (t->head == t->table + lVar1)) {
      t->tail = (lh_entry *)0x0;
      t->head = (lh_entry *)0x0;
    }
    else if (t->head == t->table + lVar1) {
      t->head->next->prev = (lh_entry *)0x0;
      t->head = t->head->next;
    }
    else if (t->tail == t->table + lVar1) {
      t->tail->prev->next = (lh_entry *)0x0;
      t->tail = t->tail->prev;
    }
    else {
      (t->table[lVar1].prev)->next = t->table[lVar1].next;
      (t->table[lVar1].next)->prev = t->table[lVar1].prev;
    }
    t->table[lVar1].prev = (lh_entry *)0x0;
    t->table[lVar1].next = (lh_entry *)0x0;
    t_local._4_4_ = 0;
  }
  return t_local._4_4_;
}

Assistant:

int lh_table_delete_entry(struct lh_table *t, struct lh_entry *e)
{
	/* CAW: fixed to be 64bit nice, still need the crazy negative case... */
	ptrdiff_t n = (ptrdiff_t)(e - t->table);

	/* CAW: this is bad, really bad, maybe stack goes other direction on this machine... */
	if (n < 0)
	{
		return -2;
	}

	if (t->table[n].k == LH_EMPTY || t->table[n].k == LH_FREED)
		return -1;
	t->count--;
	if (t->free_fn)
		t->free_fn(e);
	t->table[n].v = NULL;
	t->table[n].k = LH_FREED;
	if (t->tail == &t->table[n] && t->head == &t->table[n])
	{
		t->head = t->tail = NULL;
	}
	else if (t->head == &t->table[n])
	{
		t->head->next->prev = NULL;
		t->head = t->head->next;
	}
	else if (t->tail == &t->table[n])
	{
		t->tail->prev->next = NULL;
		t->tail = t->tail->prev;
	}
	else
	{
		t->table[n].prev->next = t->table[n].next;
		t->table[n].next->prev = t->table[n].prev;
	}
	t->table[n].next = t->table[n].prev = NULL;
	return 0;
}